

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV1ObjectBlock(Parser *this,BaseNode *node)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  int iDepth;
  BaseNode *node_local;
  Parser *this_local;
  
  local_1c = 0;
LAB_004902bf:
  if (*this->filePtr == '*') {
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"NODE_NAME",9);
    if (bVar1) {
      bVar1 = ParseString(this,&node->mName,"*NODE_NAME");
      if (!bVar1) {
        SkipToNextToken(this);
      }
      goto LAB_004902bf;
    }
    bVar1 = TokenMatch<char_const>(&this->filePtr,"NODE_PARENT",0xb);
    if (bVar1) {
      bVar1 = ParseString(this,&node->mParent,"*NODE_PARENT");
      if (!bVar1) {
        SkipToNextToken(this);
      }
      goto LAB_004902bf;
    }
    bVar1 = TokenMatch<char_const>(&this->filePtr,"NODE_TM",7);
    if (bVar1) {
      ParseLV2NodeTransformBlock(this,node);
      goto LAB_004902bf;
    }
    bVar1 = TokenMatch<char_const>(&this->filePtr,"TM_ANIMATION",0xc);
    if (bVar1) {
      ParseLV2AnimationBlock(this,node);
      goto LAB_004902bf;
    }
    if (node->mType == Light) {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_SETTINGS",0xe);
      if (bVar1) {
        ParseLV2LightSettingsBlock(this,(Light *)node);
        goto LAB_004902bf;
      }
      bVar1 = TokenMatch<char_const>(&this->filePtr,"LIGHT_TYPE",10);
      if (bVar1) {
        iVar2 = ASSIMP_strincmp("omni",this->filePtr,4);
        if (iVar2 == 0) {
          *(undefined4 *)&node->field_0x154 = 0;
        }
        else {
          iVar2 = ASSIMP_strincmp("target",this->filePtr,6);
          if (iVar2 == 0) {
            *(undefined4 *)&node->field_0x154 = 1;
          }
          else {
            iVar2 = ASSIMP_strincmp("free",this->filePtr,4);
            if (iVar2 == 0) {
              *(undefined4 *)&node->field_0x154 = 2;
            }
            else {
              iVar2 = ASSIMP_strincmp("directional",this->filePtr,0xb);
              if (iVar2 == 0) {
                *(undefined4 *)&node->field_0x154 = 3;
              }
              else {
                LogWarning(this,"Unknown kind of light source");
              }
            }
          }
        }
        goto LAB_004902bf;
      }
    }
    else {
      if (node->mType == Camera) {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_SETTINGS",0xf);
        if (bVar1) {
          ParseLV2CameraSettingsBlock(this,(Camera *)node);
        }
        else {
          bVar1 = TokenMatch<char_const>(&this->filePtr,"CAMERA_TYPE",0xb);
          if (!bVar1) goto LAB_004906c3;
          iVar2 = ASSIMP_strincmp("target",this->filePtr,6);
          if (iVar2 == 0) {
            *(undefined4 *)&node[1].mName = 1;
          }
          else {
            iVar2 = ASSIMP_strincmp("free",this->filePtr,4);
            if (iVar2 == 0) {
              *(undefined4 *)&node[1].mName = 0;
            }
            else {
              LogWarning(this,"Unknown kind of camera");
            }
          }
        }
        goto LAB_004902bf;
      }
      if (node->mType == Mesh) {
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH",4);
        if ((bVar1) || (bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_SOFTSKIN",0xd), bVar1))
        {
          ParseLV2MeshBlock(this,(Mesh *)&node[-1].mTargetAnim.akeyRotations.
                                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>.
                                          _M_impl.super__Vector_impl_data._M_finish);
          goto LAB_004902bf;
        }
        bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_REF",0xc);
        if (bVar1) {
          ParseLV4MeshLong(this,(uint *)&node[1].mTargetAnim.akeyRotations);
          goto LAB_004902bf;
        }
      }
    }
  }
  else if (*this->filePtr == '{') {
    local_1c = local_1c + 1;
  }
  else if (*this->filePtr == '}') {
    local_1c = local_1c + -1;
    if (local_1c == 0) {
      this->filePtr = this->filePtr + 1;
      SkipToNextToken(this);
      return;
    }
  }
  else if (*this->filePtr == '\0') {
    return;
  }
LAB_004906c3:
  bVar1 = IsLineEnd<char>(*this->filePtr);
  if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
    this->iLineNumber = this->iLineNumber + 1;
    this->bLastWasEndLine = true;
  }
  else {
    this->bLastWasEndLine = false;
  }
  this->filePtr = this->filePtr + 1;
  goto LAB_004902bf;
}

Assistant:

void Parser::ParseLV1ObjectBlock(ASE::BaseNode& node)
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // first process common tokens such as node name and transform
            // name of the mesh/node
            if (TokenMatch(filePtr,"NODE_NAME" ,9))
            {
                if(!ParseString(node.mName,"*NODE_NAME"))
                    SkipToNextToken();
                continue;
            }
            // name of the parent of the node
            if (TokenMatch(filePtr,"NODE_PARENT" ,11) )
            {
                if(!ParseString(node.mParent,"*NODE_PARENT"))
                    SkipToNextToken();
                continue;
            }
            // transformation matrix of the node
            if (TokenMatch(filePtr,"NODE_TM" ,7))
            {
                ParseLV2NodeTransformBlock(node);
                continue;
            }
            // animation data of the node
            if (TokenMatch(filePtr,"TM_ANIMATION" ,12))
            {
                ParseLV2AnimationBlock(node);
                continue;
            }

            if (node.mType == BaseNode::Light)
            {
                // light settings
                if (TokenMatch(filePtr,"LIGHT_SETTINGS" ,14))
                {
                    ParseLV2LightSettingsBlock((ASE::Light&)node);
                    continue;
                }
                // type of the light source
                if (TokenMatch(filePtr,"LIGHT_TYPE" ,10))
                {
                    if (!ASSIMP_strincmp("omni",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::OMNI;
                    }
                    else if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::FREE;
                    }
                    else if (!ASSIMP_strincmp("directional",filePtr,11))
                    {
                        ((ASE::Light&)node).mLightType = ASE::Light::DIRECTIONAL;
                    }
                    else
                    {
                        LogWarning("Unknown kind of light source");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Camera)
            {
                // Camera settings
                if (TokenMatch(filePtr,"CAMERA_SETTINGS" ,15))
                {
                    ParseLV2CameraSettingsBlock((ASE::Camera&)node);
                    continue;
                }
                else if (TokenMatch(filePtr,"CAMERA_TYPE" ,11))
                {
                    if (!ASSIMP_strincmp("target",filePtr,6))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::TARGET;
                    }
                    else if (!ASSIMP_strincmp("free",filePtr,4))
                    {
                        ((ASE::Camera&)node).mCameraType = ASE::Camera::FREE;
                    }
                    else
                    {
                        LogWarning("Unknown kind of camera");
                    }
                    continue;
                }
            }
            else if (node.mType == BaseNode::Mesh)
            {
                // mesh data
                // FIX: Older files use MESH_SOFTSKIN
                if (TokenMatch(filePtr,"MESH" ,4) ||
                    TokenMatch(filePtr,"MESH_SOFTSKIN",13))
                {
                    ParseLV2MeshBlock((ASE::Mesh&)node);
                    continue;
                }
                // mesh material index
                if (TokenMatch(filePtr,"MATERIAL_REF" ,12))
                {
                    ParseLV4MeshLong(((ASE::Mesh&)node).iMaterialIndex);
                    continue;
                }
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
    return;
}